

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

string * __thiscall
Restaurant::logOpenTableMsg_abi_cxx11_(string *__return_storage_ptr__,Restaurant *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->newMsg);
  return __return_storage_ptr__;
}

Assistant:

std::string Restaurant::logOpenTableMsg()
{
    return newMsg;
}